

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O0

AvxVideoWriter * aom_video_writer_open(char *filename,AvxContainer container,AvxVideoInfo *info)

{
  undefined8 uVar1;
  FILE *__stream;
  undefined8 *in_RDX;
  char in_SIL;
  char *in_RDI;
  FILE *file;
  AvxVideoWriter *writer;
  int in_stack_00000354;
  AvxVideoInfo *in_stack_00000358;
  FILE *in_stack_00000360;
  AvxVideoWriter *local_8;
  
  if (in_SIL == '\0') {
    __stream = fopen64(in_RDI,"wb");
    if (__stream == (FILE *)0x0) {
      local_8 = (AvxVideoWriter *)0x0;
    }
    else {
      local_8 = (AvxVideoWriter *)malloc(0x28);
      if (local_8 == (AvxVideoWriter *)0x0) {
        fclose(__stream);
        local_8 = (AvxVideoWriter *)0x0;
      }
      else {
        local_8->frame_count = 0;
        uVar1 = *in_RDX;
        (local_8->info).codec_fourcc = (int)uVar1;
        (local_8->info).frame_width = (int)((ulong)uVar1 >> 0x20);
        uVar1 = in_RDX[1];
        (local_8->info).frame_height = (int)uVar1;
        (local_8->info).time_base.numerator = (int)((ulong)uVar1 >> 0x20);
        *(undefined8 *)&(local_8->info).time_base.denominator = in_RDX[2];
        local_8->file = (FILE *)__stream;
        write_header(in_stack_00000360,in_stack_00000358,in_stack_00000354);
      }
    }
  }
  else {
    local_8 = (AvxVideoWriter *)0x0;
  }
  return local_8;
}

Assistant:

AvxVideoWriter *aom_video_writer_open(const char *filename,
                                      AvxContainer container,
                                      const AvxVideoInfo *info) {
  if (container == kContainerIVF) {
    AvxVideoWriter *writer = NULL;
    FILE *const file = fopen(filename, "wb");
    if (!file) return NULL;

    writer = malloc(sizeof(*writer));
    if (!writer) {
      fclose(file);
      return NULL;
    }
    writer->frame_count = 0;
    writer->info = *info;
    writer->file = file;

    write_header(writer->file, info, 0);

    return writer;
  }

  return NULL;
}